

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O0

curi_status parse_port(char *uri,size_t len,size_t *offset,curi_settings *settings,void *userData)

{
  curi_status cVar1;
  _func_void_ptr_void_ptr_size_t *p_Stack_40;
  curi_status subStatus;
  size_t subOffset;
  size_t initialOffset;
  void *userData_local;
  curi_settings *settings_local;
  size_t *offset_local;
  size_t len_local;
  char *uri_local;
  
  subOffset = *offset;
  initialOffset = (size_t)userData;
  userData_local = settings;
  settings_local = (curi_settings *)offset;
  offset_local = (size_t *)len;
  len_local = (size_t)uri;
  while( true ) {
    p_Stack_40 = settings_local->allocate;
    cVar1 = parse_digit((char *)len_local,(size_t)offset_local,(size_t *)&stack0xffffffffffffffc0,
                        (curi_settings *)userData_local,(void *)initialOffset);
    if (cVar1 != curi_status_success) break;
    settings_local->allocate = p_Stack_40;
  }
  cVar1 = handle_port((char *)(len_local + subOffset),(long)settings_local->allocate - subOffset,
                      (curi_settings *)userData_local,(void *)initialOffset);
  return cVar1;
}

Assistant:

static curi_status parse_port(const char* uri, size_t len, size_t* offset, const curi_settings* settings, void* userData)
{
    // port = *DIGIT
    const size_t initialOffset = *offset;

    for ( ; ; )
    {
        size_t subOffset = *offset;
        curi_status subStatus = parse_digit(uri, len, &subOffset, settings, userData);

        if (subStatus == curi_status_success)
            *offset = subOffset;
        else
            break;
    }

    return handle_port(uri + initialOffset, *offset - initialOffset, settings, userData);
}